

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pss)

{
  unsigned_long_long uVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  uVar1 = 0;
  if (params.fParams.contentSizeFlag != 0) {
    uVar1 = pss + 1;
  }
  zcs->streamStage = zcss_init;
  if (pss != 0) {
    uVar1 = pss + 1;
  }
  zcs->pledgedSrcSizePlusOne = uVar1;
  sVar2 = ZSTD_checkCParams(params.cParams);
  if (sVar2 < 0xffffffffffffff89) {
    auVar5._0_4_ = -(uint)(0x7fffffe9 < (int)(params.cParams.windowLog - 0x20 ^ 0x80000000));
    auVar5._4_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.chainLog - 0x1f ^ 0x80000000));
    auVar5._8_4_ = -(uint)(0x7fffffe6 < (int)(params.cParams.hashLog - 0x1f ^ 0x80000000));
    auVar5._12_4_ = -(uint)(0x7fffffe1 < (int)(params.cParams.searchLog - 0x1f ^ 0x80000000));
    iVar4 = movmskps((int)pss,auVar5);
    if ((((iVar4 != 0xf) || (params.cParams.minMatch - 8 < 0xfffffffb)) ||
        (0x20000 < params.cParams.targetLength)) ||
       (params.cParams.strategy + ~ZSTD_btultra2 < 0xfffffff7)) {
      __assert_fail("!ZSTD_checkCParams(params->cParams)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5259,
                    "void ZSTD_CCtxParams_setZstdParams(ZSTD_CCtx_params *, const ZSTD_parameters *)"
                   );
    }
    (zcs->requestedParams).cParams.searchLog = (int)params.cParams._12_8_;
    (zcs->requestedParams).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
    (zcs->requestedParams).cParams.targetLength = (int)params.cParams._20_8_;
    (zcs->requestedParams).cParams.strategy = (int)((ulong)params.cParams._20_8_ >> 0x20);
    (zcs->requestedParams).cParams.windowLog = (int)params.cParams._0_8_;
    (zcs->requestedParams).cParams.chainLog = (int)((ulong)params.cParams._0_8_ >> 0x20);
    (zcs->requestedParams).cParams.hashLog = (int)params.cParams._8_8_;
    (zcs->requestedParams).cParams.searchLog = (int)((ulong)params.cParams._8_8_ >> 0x20);
    (zcs->requestedParams).fParams.contentSizeFlag = (int)params.fParams._0_8_;
    (zcs->requestedParams).fParams.checksumFlag = (int)((ulong)params.fParams._0_8_ >> 0x20);
    (zcs->requestedParams).fParams.noDictIDFlag = params.fParams.noDictIDFlag;
    (zcs->requestedParams).compressionLevel = 0;
    sVar3 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
    sVar2 = 0;
    if (0xffffffffffffff88 < sVar3) {
      sVar2 = sVar3;
    }
  }
  return sVar2;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pss)
{
    /* for compatibility with older programs relying on this behavior.
     * Users should now specify ZSTD_CONTENTSIZE_UNKNOWN.
     * This line will be removed in the future.
     */
    U64 const pledgedSrcSize = (pss==0 && params.fParams.contentSizeFlag==0) ? ZSTD_CONTENTSIZE_UNKNOWN : pss;
    DEBUGLOG(4, "ZSTD_initCStream_advanced");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    FORWARD_IF_ERROR( ZSTD_checkCParams(params.cParams) , "");
    ZSTD_CCtxParams_setZstdParams(&zcs->requestedParams, &params);
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}